

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O1

void __thiscall
xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
AddEdge(Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> *this,
       StateExample sstate,StateExample dstate,double trans)

{
  long lVar1;
  vertex_iterator vVar2;
  long *plVar3;
  ostream *poVar4;
  vertex_iterator vVar5;
  _List_node_base *p_Var6;
  long *plVar7;
  
  vVar2 = ObtainVertexFromVertexMap(this,sstate);
  plVar7 = (long *)(*(long *)((long)vVar2.super_const_vertex_iterator.super_VertexMapTypeIterator.
                                    super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
                                    ._M_cur + 0x10) + 0x18);
  plVar3 = plVar7;
  do {
    plVar3 = (long *)*plVar3;
    if (plVar3 == plVar7) break;
  } while (**(long **)(plVar3[3] + 0x10) != dstate.id);
  if (plVar3 != plVar7) {
    plVar3[4] = (long)trans;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"updated cost: ",0xe);
    poVar4 = std::ostream::_M_insert<double>(trans);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return;
  }
  vVar5 = ObtainVertexFromVertexMap(this,dstate);
  lVar1 = *(long *)((long)vVar5.super_const_vertex_iterator.super_VertexMapTypeIterator.
                          super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
                          ._M_cur + 0x10);
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next =
       (_List_node_base *)
       vVar2.super_const_vertex_iterator.super_VertexMapTypeIterator.
       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
       ._M_cur;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  plVar3 = (long *)(lVar1 + 0x40);
  *plVar3 = *plVar3 + 1;
  lVar1 = *(long *)((long)vVar2.super_const_vertex_iterator.super_VertexMapTypeIterator.
                          super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
                          ._M_cur + 0x10);
  p_Var6 = (_List_node_base *)operator_new(0x28);
  p_Var6[1]._M_next =
       (_List_node_base *)
       vVar2.super_const_vertex_iterator.super_VertexMapTypeIterator.
       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
       ._M_cur;
  p_Var6[1]._M_prev =
       (_List_node_base *)
       vVar5.super_const_vertex_iterator.super_VertexMapTypeIterator.
       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
       ._M_cur;
  p_Var6[2]._M_next = (_List_node_base *)trans;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  plVar3 = (long *)(lVar1 + 0x28);
  *plVar3 = *plVar3 + 1;
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::AddEdge(State sstate, State dstate,
                                                     Transition trans) {
  auto src_vertex = ObtainVertexFromVertexMap(sstate);

  // update transition if edge already exists
  auto it = src_vertex->FindEdge(dstate);
  if (it != src_vertex->edge_end()) {
    it->cost = trans;
    std::cout << "updated cost: " << trans << std::endl;
    return;
  }

  // otherwise add new edge
  auto dst_vertex = ObtainVertexFromVertexMap(dstate);
  dst_vertex->vertices_from.push_back(src_vertex);
  src_vertex->edges_to.emplace_back(src_vertex, dst_vertex, trans);
}